

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFunctions.cpp
# Opt level: O0

BasicValue *
cvm::Ncurses::NoEcho
          (BasicValue *__return_storage_ptr__,
          list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *param_1)

{
  int I;
  list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *param_0_local;
  
  I = noecho();
  BasicValue::BasicValue(__return_storage_ptr__,I);
  return __return_storage_ptr__;
}

Assistant:

BasicValue Ncurses::NoEcho(std::list<BasicValue> &/*Args*/) {
  return ::noecho();
}